

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

bool __thiscall
wallet::SQLiteBatch::WriteKey(SQLiteBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  pointer pbVar1;
  size_type sVar2;
  string_view source_file;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Logger *pLVar6;
  void *__stat_loc;
  string *in_R9;
  pointer pbVar7;
  sqlite3_stmt *this_00;
  long in_FS_OFFSET;
  string_view str;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  string_view logging_function;
  string log_msg;
  char local_e8 [112];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    if ((this->m_insert_stmt == (sqlite3_stmt *)0x0) ||
       (this->m_overwrite_stmt == (sqlite3_stmt *)0x0)) {
      __assert_fail("m_insert_stmt && m_overwrite_stmt",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1e6,
                    "virtual bool wallet::SQLiteBatch::WriteKey(DataStream &&, DataStream &&, bool)"
                   );
    }
    this_00 = this->m_insert_stmt;
    if (overwrite) {
      this_00 = this->m_overwrite_stmt;
    }
    pbVar7 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    pbVar1 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    sVar2 = key->m_read_pos;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"key","");
    pbVar7 = pbVar7 + sVar2;
    blob.m_size = (size_t)&local_58;
    blob.m_data = pbVar1 + -(long)pbVar7;
    bVar3 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)0x1,(int)pbVar7,blob,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3) {
      pbVar7 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      sVar2 = value->m_read_pos;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value","");
      pbVar7 = pbVar7 + sVar2;
      args_1 = &local_58;
      __stat_loc = (void *)0x2;
      blob_00.m_size = (size_t)args_1;
      blob_00.m_data = pbVar1 + -(long)pbVar7;
      bVar3 = BindBlobToStatement((wallet *)this_00,(sqlite3_stmt *)0x2,(int)pbVar7,blob_00,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        __stat_loc = (void *)(CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
        operator_delete(local_58._M_dataplus._M_p,(ulong)__stat_loc);
      }
      if (bVar3) {
        if (this->m_txn == false) {
          CSemaphore::wait(&this->m_database->m_write_semaphore,__stat_loc);
        }
        iVar5 = sqlite3_step(this_00);
        sqlite3_clear_bindings(this_00);
        sqlite3_reset(this_00);
        bVar3 = iVar5 == 0x65;
        if (!bVar3) {
          local_e8._0_8_ = sqlite3_errstr(iVar5);
          pLVar6 = LogInstance();
          bVar4 = BCLog::Logger::Enabled(pLVar6);
          if (bVar4) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            tinyformat::format<char[9],char_const*>
                      (&local_78,(tinyformat *)"%s: Unable to execute statement: %s\n","WriteKey",
                       (char (*) [9])local_e8,(char **)args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar6 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x5a;
            local_78._M_string_length = 0x85e8e8;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
            ;
            source_file._M_len = 0x5a;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function._M_str = "WriteKey";
            logging_function._M_len = 8;
            BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x1fc,ALL,Info);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        if (this->m_txn == false) {
          CSemaphore::post(&this->m_database->m_write_semaphore);
        }
        goto LAB_005749ec;
      }
    }
  }
  bVar3 = false;
LAB_005749ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_database.m_db) return false;
    assert(m_insert_stmt && m_overwrite_stmt);

    sqlite3_stmt* stmt;
    if (overwrite) {
        stmt = m_overwrite_stmt;
    } else {
        stmt = m_insert_stmt;
    }

    // Bind: leftmost parameter in statement is index 1
    // Insert index 1 is key, 2 is value
    if (!BindBlobToStatement(stmt, 1, key, "key")) return false;
    if (!BindBlobToStatement(stmt, 2, value, "value")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}